

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::setReadOnly(QLineEdit *this,bool enable)

{
  QLineEditPrivate *this_00;
  bool enabled;
  long in_FS_OFFSET;
  QAccessibleStateChangeEvent ev;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QCursor local_58;
  undefined8 uStack_50;
  QLineEdit *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if ((bool)((this_00->control->field_0x50 & 4) >> 2) != enable) {
    QWidgetLineControl::setReadOnly((QWidgetLineControl *)this_00->control,enable);
    enabled = !enable;
    QLineEditPrivate::setClearButtonEnabled(this_00,enabled);
    QWidget::setAttribute(&this->super_QWidget,WA_MacShowFocusRect,enabled);
    QWidget::setAttribute
              (&this->super_QWidget,WA_InputMethodEnabled,
               (*(ushort *)&this_00->control->field_0x50 & 4) == 0);
    QCursor::QCursor(&local_58,(uint)enabled << 2);
    QWidget::setCursor(&this->super_QWidget,&local_58);
    QCursor::~QCursor(&local_58);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_68,ReadOnlyChange);
    QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_68);
    QWidget::update(&this->super_QWidget);
    uStack_40 = 0xaaaaaaaaffffffff;
    local_58.d = (QCursorData *)QCss::ValueExtractor::extractGeometry;
    local_38 = 0x100;
    uStack_50 = 0xaaaaaaaa0000800a;
    local_48 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_58);
    QEvent::~QEvent((QEvent *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::setReadOnly(bool enable)
{
    Q_D(QLineEdit);
    if (d->control->isReadOnly() != enable) {
        d->control->setReadOnly(enable);
        d->setClearButtonEnabled(!enable);
        setAttribute(Qt::WA_MacShowFocusRect, !enable);
        setAttribute(Qt::WA_InputMethodEnabled, d->shouldEnableInputMethod());
#ifndef QT_NO_CURSOR
        setCursor(enable ? Qt::ArrowCursor : Qt::IBeamCursor);
#endif
        QEvent event(QEvent::ReadOnlyChange);
        QCoreApplication::sendEvent(this, &event);
        update();
#if QT_CONFIG(accessibility)
        QAccessible::State changedState;
        changedState.readOnly = true;
        QAccessibleStateChangeEvent ev(this, changedState);
        QAccessible::updateAccessibility(&ev);
#endif
    }
}